

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

FunctionBody * __thiscall
TTD::TTDebuggerSourceLocation::UpdatePostInflateFunctionBody_Helper
          (TTDebuggerSourceLocation *this,FunctionBody *rootBody)

{
  ULONG UVar1;
  uint uVar2;
  ULONG UVar3;
  ParseableFunctionInfo *pfi;
  FunctionBody *pFVar4;
  FunctionBody *found;
  FunctionBody *ifb;
  ParseableFunctionInfo *ipfi;
  uint32 i;
  FunctionBody *rootBody_local;
  TTDebuggerSourceLocation *this_local;
  
  ipfi._4_4_ = 0;
  while( true ) {
    uVar2 = Js::ParseableFunctionInfo::GetNestedCount(&rootBody->super_ParseableFunctionInfo);
    if (uVar2 <= ipfi._4_4_) {
      return (FunctionBody *)0x0;
    }
    pfi = Js::ParseableFunctionInfo::GetNestedFunctionForExecution
                    (&rootBody->super_ParseableFunctionInfo,ipfi._4_4_);
    pFVar4 = JsSupport::ForceAndGetFunctionBody(pfi);
    UVar1 = this->m_functionLine;
    UVar3 = Js::ParseableFunctionInfo::GetLineNumber(&pFVar4->super_ParseableFunctionInfo);
    if ((UVar1 == UVar3) &&
       (UVar1 = this->m_functionColumn,
       UVar3 = Js::ParseableFunctionInfo::GetColumnNumber(&pFVar4->super_ParseableFunctionInfo),
       UVar1 == UVar3)) break;
    pFVar4 = UpdatePostInflateFunctionBody_Helper(this,pFVar4);
    if (pFVar4 != (FunctionBody *)0x0) {
      return pFVar4;
    }
    ipfi._4_4_ = ipfi._4_4_ + 1;
  }
  return pFVar4;
}

Assistant:

Js::FunctionBody* TTDebuggerSourceLocation::UpdatePostInflateFunctionBody_Helper(Js::FunctionBody* rootBody) const
    {
        for(uint32 i = 0; i < rootBody->GetNestedCount(); ++i)
        {
            Js::ParseableFunctionInfo* ipfi = rootBody->GetNestedFunctionForExecution(i);
            Js::FunctionBody* ifb = JsSupport::ForceAndGetFunctionBody(ipfi);

            if(this->m_functionLine == ifb->GetLineNumber() && this->m_functionColumn == ifb->GetColumnNumber())
            {
                return ifb;
            }
            else
            {
                Js::FunctionBody* found = this->UpdatePostInflateFunctionBody_Helper(ifb);
                if(found != nullptr)
                {
                    return found;
                }
            }
        }

        return nullptr;
    }